

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddCacheDefinition
          (cmMakefile *this,string *name,char *value,char *doc,CacheEntryType type,bool force)

{
  bool bVar1;
  CacheEntryType CVar2;
  string *psVar3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string nvalue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  char *local_80;
  string local_78;
  ulong local_58;
  string local_50;
  
  local_80 = doc;
  psVar3 = cmState::GetInitializedCacheValue(this->GlobalGenerator->CMakeInstance->State,name);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if ((psVar3 != (string *)0x0) &&
     (CVar2 = cmState::GetCacheEntryType(this->GlobalGenerator->CMakeInstance->State,name),
     CVar2 == UNINITIALIZED)) {
    if (!force) {
      value = (psVar3->_M_dataplus)._M_p;
    }
    if (type - PATH < 2) {
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::assign((char *)&local_78);
      cmSystemTools::ExpandListArgument(&local_78,&local_98,false);
      local_78._M_string_length = 0;
      local_58 = (ulong)type;
      *local_78._M_dataplus._M_p = '\0';
      lVar5 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1)
      {
        bVar1 = cmSystemTools::IsOff
                          ((string *)
                           ((long)&((local_98.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar5));
        if (!bVar1) {
          cmsys::SystemTools::CollapseFullPath
                    (&local_50,
                     (string *)
                     ((long)&((local_98.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     ));
          std::__cxx11::string::operator=
                    ((string *)
                     ((long)&((local_98.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     ),(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        if (uVar4 != 0) {
          std::__cxx11::string::append((char *)&local_78);
        }
        std::__cxx11::string::append((string *)&local_78);
        lVar5 = lVar5 + 0x20;
      }
      type = (CacheEntryType)local_58;
      cmake::AddCacheEntry
                (this->GlobalGenerator->CMakeInstance,name,local_78._M_dataplus._M_p,local_80,type);
      cmState::GetInitializedCacheValue(this->GlobalGenerator->CMakeInstance->State,name);
      std::__cxx11::string::_M_assign((string *)&local_78);
      value = local_78._M_dataplus._M_p;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
    }
  }
  cmake::AddCacheEntry(this->GlobalGenerator->CMakeInstance,name,value,local_80,type);
  cmStateSnapshot::RemoveDefinition(&this->StateSnapshot,name);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmMakefile::AddCacheDefinition(const std::string& name, const char* value,
                                    const char* doc,
                                    cmStateEnums::CacheEntryType type,
                                    bool force)
{
  const std::string* existingValue =
    this->GetState()->GetInitializedCacheValue(name);
  // must be outside the following if() to keep it alive long enough
  std::string nvalue;

  if (existingValue &&
      (this->GetState()->GetCacheEntryType(name) ==
       cmStateEnums::UNINITIALIZED)) {
    // if this is not a force, then use the value from the cache
    // if it is a force, then use the value being passed in
    if (!force) {
      value = existingValue->c_str();
    }
    if (type == cmStateEnums::PATH || type == cmStateEnums::FILEPATH) {
      std::vector<std::string>::size_type cc;
      std::vector<std::string> files;
      nvalue = value ? value : "";

      cmSystemTools::ExpandListArgument(nvalue, files);
      nvalue.clear();
      for (cc = 0; cc < files.size(); cc++) {
        if (!cmSystemTools::IsOff(files[cc])) {
          files[cc] = cmSystemTools::CollapseFullPath(files[cc]);
        }
        if (cc > 0) {
          nvalue += ";";
        }
        nvalue += files[cc];
      }

      this->GetCMakeInstance()->AddCacheEntry(name, nvalue.c_str(), doc, type);
      nvalue = *this->GetState()->GetInitializedCacheValue(name);
      value = nvalue.c_str();
    }
  }
  this->GetCMakeInstance()->AddCacheEntry(name, value, doc, type);
  // if there was a definition then remove it
  this->StateSnapshot.RemoveDefinition(name);
}